

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::~CommsInterface(CommsInterface *this)

{
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_RDI;
  CommsInterface *unaff_retaddr;
  
  (in_RDI->m_pushLock).super___mutex_base._M_mutex.__align = (long)&PTR__CommsInterface_00a6ad10;
  join_tx_rx_thread(unaff_retaddr);
  gmlc::concurrency::TripWireDetector::~TripWireDetector((TripWireDetector *)0x461059);
  CLI::std::thread::~thread((thread *)0x46106a);
  CLI::std::thread::~thread((thread *)0x46107b);
  gmlc::containers::
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  ::~BlockingPriorityQueue(in_RDI);
  CLI::std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x46109d);
  CLI::std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x4610ae);
  gmlc::concurrency::TriggerVariable::~TriggerVariable((TriggerVariable *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  gmlc::concurrency::TriggerVariable::~TriggerVariable((TriggerVariable *)in_RDI);
  return;
}

Assistant:

CommsInterface::~CommsInterface()
{
    join_tx_rx_thread();
}